

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.cpp
# Opt level: O1

size_t duckdb_zstd::ZSTD_estimateCStreamSize_usingCParams(ZSTD_compressionParameters cParams)

{
  ZSTD_compressionParameters cParams_00;
  size_t sVar1;
  size_t sVar2;
  ZSTD_CCtx_params initialParams;
  undefined1 in_stack_ffffffffffffff14 [24];
  
  cParams_00._4_24_ = in_stack_ffffffffffffff14;
  cParams_00.windowLog = initialParams.format;
  ZSTD_makeCCtxParamsFromCParams(cParams_00);
  if (initialParams.format - 6 < 0xfffffffd) {
    sVar1 = ZSTD_estimateCStreamSize_usingCCtxParams((ZSTD_CCtx_params *)&stack0xffffffffffffff18);
  }
  else {
    sVar2 = ZSTD_estimateCStreamSize_usingCCtxParams((ZSTD_CCtx_params *)&stack0xffffffffffffff18);
    sVar1 = ZSTD_estimateCStreamSize_usingCCtxParams((ZSTD_CCtx_params *)&stack0xffffffffffffff18);
    if (sVar1 < sVar2) {
      sVar1 = sVar2;
    }
  }
  return sVar1;
}

Assistant:

size_t ZSTD_estimateCStreamSize_usingCParams(ZSTD_compressionParameters cParams)
{
    ZSTD_CCtx_params initialParams = ZSTD_makeCCtxParamsFromCParams(cParams);
    if (ZSTD_rowMatchFinderSupported(cParams.strategy)) {
        /* Pick bigger of not using and using row-based matchfinder for greedy and lazy strategies */
        size_t noRowCCtxSize;
        size_t rowCCtxSize;
        initialParams.useRowMatchFinder = ZSTD_ps_disable;
        noRowCCtxSize = ZSTD_estimateCStreamSize_usingCCtxParams(&initialParams);
        initialParams.useRowMatchFinder = ZSTD_ps_enable;
        rowCCtxSize = ZSTD_estimateCStreamSize_usingCCtxParams(&initialParams);
        return MAX(noRowCCtxSize, rowCCtxSize);
    } else {
        return ZSTD_estimateCStreamSize_usingCCtxParams(&initialParams);
    }
}